

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

Option * __thiscall CLI::Option::type_name(Option *this,string *typeval)

{
  string local_58 [32];
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_38;
  string *local_18;
  string *typeval_local;
  Option *this_local;
  
  local_18 = typeval;
  typeval_local = (string *)this;
  ::std::__cxx11::string::string(local_58,(string *)typeval);
  ::std::function<std::__cxx11::string()>::
  function<CLI::Option::type_name(std::__cxx11::string)::_lambda()_1_,void>
            ((function<std::__cxx11::string()> *)&local_38,(anon_class_32_1_50816887 *)local_58);
  type_name_fn(this,&local_38);
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::~function(&local_38);
  type_name(std::__cxx11::string)::{lambda()#1}::~basic_string((_lambda___1_ *)local_58);
  return this;
}

Assistant:

Option *type_name(std::string typeval) {
        type_name_fn([typeval]() { return typeval; });
        return this;
    }